

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O3

void anon_unknown.dwarf_64ae9::testMatrix(M44f *M)

{
  bool bVar1;
  float (*pafVar2) [4];
  ostream *poVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  V3f r;
  V3f t;
  V3f h;
  V3f s;
  Vec3<float> local_11c;
  float local_110;
  Vec3<float> local_10c;
  Vec3<float> local_100;
  Vec3<float> local_f4;
  Matrix44<float> local_e8;
  undefined1 local_a8 [16];
  float local_98;
  float local_88;
  float local_78;
  Matrix44<float> local_68;
  
  bVar1 = Imath_3_2::extractSHRT<float>(M,&local_f4,&local_100,&local_11c,&local_10c,true,Default);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::endl<char,std::char_traits<char>>(poVar3);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                  ,0xd4,"void (anonymous namespace)::testMatrix(const M44f)");
  }
  fVar7 = local_10c.z * 0.0;
  fVar6 = local_10c.x * 0.0 + local_10c.y * 0.0;
  local_e8.x[3][0] = fVar7 + local_10c.x + local_10c.y * 0.0 + 0.0;
  local_e8.x[3][1] = fVar7 + local_10c.y + local_10c.x * 0.0 + 0.0;
  local_e8.x[3][2] = local_10c.z + fVar6 + 0.0;
  local_e8.x[3][3] = fVar6 + fVar7 + 1.0;
  local_a8._0_4_ = cosf(local_11c.z);
  local_88 = cosf(local_11c.y);
  local_78 = cosf(local_11c.x);
  local_110 = sinf(local_11c.z);
  local_98 = sinf(local_11c.y);
  fVar6 = sinf(local_11c.x);
  fVar11 = (float)local_a8._0_4_ * local_98 * fVar6 - local_110 * local_78;
  fVar16 = (float)local_a8._0_4_ * local_78 + local_110 * local_98 * fVar6;
  fVar19 = local_110 * fVar6 + local_78 * (float)local_a8._0_4_ * local_98;
  fVar14 = local_78 * local_110 * local_98 - (float)local_a8._0_4_ * fVar6;
  fVar7 = local_88 * local_110 * 0.0;
  fVar15 = (float)local_a8._0_4_ * local_88 * 0.0;
  fVar8 = ((float)local_a8._0_4_ * local_88 + fVar7) - local_98 * 0.0;
  fVar9 = (local_88 * local_110 + fVar15) - local_98 * 0.0;
  fVar15 = fVar15 + fVar7;
  fVar10 = fVar15 - local_98;
  fVar17 = fVar16 * 0.0;
  fVar12 = fVar11 * 0.0;
  fVar13 = fVar12 + fVar17;
  fVar18 = fVar14 * 0.0;
  fVar6 = fVar6 * local_88;
  fVar7 = local_78 * local_88;
  fVar15 = -local_98 * 0.0 + fVar15;
  fVar11 = fVar6 * 0.0 + fVar11 + fVar17;
  fVar12 = fVar6 * 0.0 + fVar16 + fVar12;
  fVar16 = fVar6 + fVar13;
  fVar13 = fVar6 * 0.0 + fVar13;
  fVar6 = fVar19 * 0.0;
  fVar17 = fVar6 + fVar18;
  local_e8.x[0][2] = local_f4.x * fVar10;
  local_e8.x[0][1] = local_f4.x * fVar9;
  local_e8.x[0][0] = local_f4.x * fVar8;
  local_e8.x[1][0] = local_f4.y * (local_100.x * fVar8 + fVar11);
  local_e8.x[1][1] = local_f4.y * (local_100.x * fVar9 + fVar12);
  local_e8.x[1][2] = local_f4.y * (local_100.x * fVar10 + fVar16);
  local_e8.x[1][3] = local_f4.y * (local_100.x * fVar15 + fVar13);
  local_e8.x[0][3] = local_f4.x * fVar15;
  local_e8.x[2][0] =
       local_f4.z * (local_100.y * fVar8 + local_100.z * fVar11 + fVar7 * 0.0 + fVar19 + fVar18);
  local_e8.x[2][1] =
       local_f4.z * (local_100.y * fVar9 + local_100.z * fVar12 + fVar14 + fVar6 + fVar7 * 0.0);
  local_e8.x[2][2] = local_f4.z * (local_100.y * fVar10 + local_100.z * fVar16 + fVar7 + fVar17);
  local_e8.x[2][3] =
       local_f4.z * (local_100.y * fVar15 + local_100.z * fVar13 + fVar17 + fVar7 * 0.0);
  pafVar2 = (float (*) [4])&local_68;
  local_68.x[0][0] = M->x[0][0] - local_f4.x * fVar8;
  local_68.x[0][1] = M->x[0][1] - local_f4.x * fVar9;
  local_68.x[0][2] = M->x[0][2] - local_e8.x[0][2];
  local_68.x[0][3] = M->x[0][3] - local_f4.x * fVar15;
  local_68.x[1][0] = M->x[1][0] - local_e8.x[1][0];
  local_68.x[1][1] = M->x[1][1] - local_e8.x[1][1];
  local_68.x[1][2] = M->x[1][2] - local_e8.x[1][2];
  local_68.x[1][3] = M->x[1][3] - local_e8.x[1][3];
  local_68.x[2][0] = M->x[2][0] - local_e8.x[2][0];
  local_68.x[2][1] = M->x[2][1] - local_e8.x[2][1];
  local_68.x[2][2] = M->x[2][2] - local_e8.x[2][2];
  local_68.x[2][3] = M->x[2][3] - local_e8.x[2][3];
  local_68.x[3][0] = M->x[3][0] - local_e8.x[3][0];
  local_68.x[3][1] = M->x[3][1] - local_e8.x[3][1];
  local_68.x[3][2] = M->x[3][2] - local_e8.x[3][2];
  local_68.x[3][3] = M->x[3][3] - local_e8.x[3][3];
  lVar5 = 0;
  do {
    lVar4 = 0;
    do {
      fVar6 = (*(float (*) [4])*pafVar2)[lVar4];
      if (1e-05 < ABS(fVar6)) {
        local_a8 = ZEXT416((uint)fVar6);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)local_a8._0_4_);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar5);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar3 = Imath_3_2::operator<<(poVar3,M);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar3 = Imath_3_2::operator<<(poVar3,&local_e8);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar3 = Imath_3_2::operator<<(poVar3,&local_68);
        std::endl<char,std::char_traits<char>>(poVar3);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                      ,0xfa,"void (anonymous namespace)::testMatrix(const M44f)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar5 = lVar5 + 1;
    pafVar2 = pafVar2 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void
testMatrix (const M44f M)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    V3f s, h, r, t;

    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert (false);
    }

    M44f N;

    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.shear (h);
    N.scale (s);

    debug (("Re-scale: %f %f %f\n", s[0], s[1], s[2]));
    debug (("Re-shear: %f %f %f\n", h[0], h[1], h[2]));
    debug (("Re-rot  : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Re-trans: %f %f %f\n", t[0], t[1], t[2]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
        for (int k = 0; k < 4; ++k)
        {
            if (abs (D[j][k]) > 0.00001)
            {
                cout << "unexpectedly large matrix to "
                        "euler angles conversion error: "
                     << D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}